

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O1

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  void *local_58;
  int *piStack_50;
  size_t local_48;
  Allocator *local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  size_t local_28;
  
  (**mb->_vptr_ModelBin)(&local_58,mb,(ulong)(uint)this->scale_data_size);
  pMVar1 = &this->scale_data;
  if (pMVar1 != (Mat *)&local_58) {
    if (piStack_50 != (int *)0x0) {
      LOCK();
      *piStack_50 = *piStack_50 + 1;
      UNLOCK();
    }
    piVar2 = (this->scale_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->scale_data).data;
        pAVar4 = (this->scale_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(*(void **)((long)pvVar3 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 8))();
        }
      }
    }
    pMVar1->data = (void *)0x0;
    (this->scale_data).refcount = (int *)0x0;
    (this->scale_data).elemsize = 0;
    (this->scale_data).cstep = 0;
    (this->scale_data).dims = 0;
    (this->scale_data).w = 0;
    (this->scale_data).h = 0;
    (this->scale_data).c = 0;
    (this->scale_data).data = local_58;
    (this->scale_data).refcount = piStack_50;
    (this->scale_data).elemsize = local_48;
    (this->scale_data).allocator = local_40;
    (this->scale_data).dims = local_38;
    (this->scale_data).w = iStack_34;
    (this->scale_data).h = iStack_30;
    (this->scale_data).c = iStack_2c;
    (this->scale_data).cstep = local_28;
  }
  if (piStack_50 != (int *)0x0) {
    LOCK();
    *piStack_50 = *piStack_50 + -1;
    UNLOCK();
    if (*piStack_50 == 0) {
      if (local_40 == (Allocator *)0x0) {
        if (local_58 != (void *)0x0) {
          free(*(void **)((long)local_58 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_40 + 8))();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    iVar5 = -100;
  }
  else {
    iVar5 = -100;
    if ((long)(this->scale_data).c * (this->scale_data).cstep != 0) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}